

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidReshapeStaticNoTargetShape(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this;
  Type *this_00;
  ReshapeStaticLayerParams *this_01;
  ostream *poVar8;
  string *psVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  Result res1;
  Model m;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Model local_48;
  
  CoreML::Specification::Model::Model(&local_48);
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_48.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_70 + 0x10;
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  pRVar1 = &pAVar7->shape_;
  iVar12 = (pAVar7->shape_).total_size_;
  if ((pAVar7->shape_).current_size_ == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  iVar11 = iVar12 + 1;
  (pAVar7->shape_).current_size_ = iVar11;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 3;
  iVar12 = (pAVar7->shape_).total_size_;
  if (iVar11 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  iVar11 = iVar12 + 1;
  (pAVar7->shape_).current_size_ = iVar11;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 5;
  iVar12 = (pAVar7->shape_).total_size_;
  if (iVar11 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  (pAVar7->shape_).current_size_ = iVar12 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 2;
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_48.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  pRVar1 = &pAVar7->shape_;
  iVar12 = (pAVar7->shape_).total_size_;
  if ((pAVar7->shape_).current_size_ == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  iVar11 = iVar12 + 1;
  (pAVar7->shape_).current_size_ = iVar11;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 3;
  iVar12 = (pAVar7->shape_).total_size_;
  if (iVar11 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  iVar11 = iVar12 + 1;
  (pAVar7->shape_).current_size_ = iVar11;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 5;
  iVar12 = (pAVar7->shape_).total_size_;
  if (iVar11 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar12 + 1);
  }
  iVar12 = (pAVar7->shape_).current_size_;
  (pAVar7->shape_).current_size_ = iVar12 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar12] = 2;
  if (local_48._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_48);
    local_48._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_48.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_48.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_48.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] != 0x474) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x474;
    this_01 = (ReshapeStaticLayerParams *)operator_new(0x28);
    CoreML::Specification::ReshapeStaticLayerParams::ReshapeStaticLayerParams(this_01);
    (this_00->layer_).reshapestatic_ = this_01;
  }
  CoreML::validate<(MLModelType)500>((Result *)local_70,&local_48);
  bVar3 = CoreML::Result::good((Result *)local_70);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x15ff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  }
  else {
    psVar9 = CoreML::Result::message_abi_cxx11_((Result *)local_70);
    iVar12 = 0;
    lVar10 = std::__cxx11::string::find((char *)psVar9,0x3027aa,0);
    if (lVar10 != -1) goto LAB_00195617;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1600);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"res1.message().find(\"Target shape\") != std::string::npos",0x38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  }
  std::ostream::put((char)poVar8);
  iVar12 = 1;
  std::ostream::flush();
LAB_00195617:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._8_8_ != &local_58) {
    operator_delete((void *)local_70._8_8_,local_58._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_48);
  return iVar12;
}

Assistant:

int testInvalidReshapeStaticNoTargetShape() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // missing required parameters
    layers->mutable_reshapestatic();

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Target shape") != std::string::npos);

    return 0;

}